

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SkipWhitespaceAndNewline(AsciiParser *this,bool allow_semicolon)

{
  int *piVar1;
  ulong uVar2;
  uint8_t uVar3;
  StreamReader *pSVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  int iVar8;
  byte in_R10B;
  bool bVar9;
  
  pSVar4 = this->_sr;
  uVar5 = pSVar4->length_;
  uVar7 = pSVar4->idx_;
  do {
    if (uVar5 <= uVar7) {
      return true;
    }
    if (pSVar4->binary_[uVar7] == '\0') {
      return true;
    }
    uVar6 = uVar7;
    if (uVar7 < uVar5) {
      uVar6 = uVar7 + 1;
      in_R10B = pSVar4->binary_[uVar7];
      pSVar4->idx_ = uVar6;
    }
    iVar8 = 1;
    bVar9 = uVar5 <= uVar7;
    uVar7 = uVar6;
    if (bVar9) goto LAB_0037866c;
    if (((in_R10B < 0x21) && ((0x100001200U >> ((ulong)in_R10B & 0x3f) & 1) != 0)) ||
       (in_R10B == 0x3b && allow_semicolon)) {
      piVar1 = &(this->_curr_cursor).col;
      *piVar1 = *piVar1 + 1;
LAB_0037866a:
      iVar8 = 0;
    }
    else {
      if (in_R10B != 0xd) {
        if (in_R10B != 10) {
          if ((0 < (long)uVar6) && (uVar6 = uVar6 - 1, uVar6 <= pSVar4->length_)) {
            pSVar4->idx_ = uVar6;
            iVar8 = 3;
            uVar7 = uVar6;
          }
          goto LAB_0037866c;
        }
        (this->_curr_cursor).col = 0;
        (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
        goto LAB_0037866a;
      }
      if (uVar6 < uVar5 - 1) {
        uVar2 = uVar6 + 1;
        if (uVar2 <= uVar5) {
          uVar3 = pSVar4->binary_[uVar6];
          pSVar4->idx_ = uVar2;
          uVar7 = uVar2;
          if (uVar3 != '\n') {
            if (((long)uVar2 < 1) || (pSVar4->length_ < uVar6)) goto LAB_0037866c;
            pSVar4->idx_ = uVar6;
            uVar7 = uVar6;
          }
          goto LAB_003786c7;
        }
      }
      else {
LAB_003786c7:
        (this->_curr_cursor).col = 0;
        (this->_curr_cursor).row = (this->_curr_cursor).row + 1;
        iVar8 = 0;
      }
    }
LAB_0037866c:
    if (iVar8 != 0) {
      return iVar8 == 3;
    }
  } while( true );
}

Assistant:

bool AsciiParser::SkipWhitespaceAndNewline(const bool allow_semicolon) {
  // USDA also allow C-style ';' as a newline separator.
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    // printf("sws c = %c\n", c);

    if ((c == ' ') || (c == '\t') || (c == '\f')) {
      _curr_cursor.col++;
      // continue
    } else if (allow_semicolon && (c == ';')) {
      _curr_cursor.col++;
      // continue
    } else if (c == '\n') {
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else if (c == '\r') {
      // CRLF?
      if (_sr->tell() < (_sr->size() - 1)) {
        char d;
        if (!Char1(&d)) {
          // this should not happen.
          return false;
        }

        if (d == '\n') {
          // CRLF
        } else {
          // unwind 1 char
          if (!_sr->seek_from_current(-1)) {
            // this should not happen.
            return false;
          }
        }
      }
      _curr_cursor.col = 0;
      _curr_cursor.row++;
      // continue
    } else {
      // end loop
      if (!_sr->seek_from_current(-1)) {
        return false;
      }
      break;
    }
  }

  return true;
}